

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePath.h
# Opt level: O2

cmCMakePath * __thiscall cmCMakePath::Append(cmCMakePath *this,path *path)

{
  string local_30;
  
  std::filesystem::__cxx11::path::operator/=(&this->Path,path);
  std::filesystem::__cxx11::path::generic_string(&local_30,&this->Path);
  std::filesystem::__cxx11::path::operator=(&this->Path,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return this;
}

Assistant:

cmCMakePath& Append(const cm::filesystem::path& path)
  {
    this->Path /= path;
    // filesystem::path::append use preferred_separator ('\' on Windows)
    // so convert back to '/'
    this->Path = this->Path.generic_string();
    return *this;
  }